

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

Node * mainposition(Table *t,TValue *key)

{
  uint uVar1;
  ulong uVar2;
  Node *pNVar3;
  lua_CFunction p_Var4;
  
  uVar1 = key->tt_ & 0x3f;
  switch(uVar1) {
  case 1:
    uVar2 = (ulong)(uint)(~(-1 << (t->lsizenode & 0x1f)) & (key->value_).b);
    break;
  case 3:
    pNVar3 = hashnum(t,(key->value_).n);
    return pNVar3;
  case 4:
    uVar2 = (ulong)(~(-1 << (t->lsizenode & 0x1f)) & *(uint *)((key->value_).f + 0xc));
    break;
  default:
    if (uVar1 == 0x14) {
      p_Var4 = (key->value_).f;
      if (p_Var4[10] == (_func_int_lua_State_ptr)0x0) {
        uVar1 = luaS_hash((char *)(p_Var4 + 0x18),*(size_t *)(p_Var4 + 0x10),*(uint *)(p_Var4 + 0xc)
                         );
        *(uint *)(p_Var4 + 0xc) = uVar1;
        p_Var4[10] = (code)0x1;
        p_Var4 = (key->value_).f;
      }
      uVar2 = (ulong)(~(-1 << (t->lsizenode & 0x1f)) & *(uint *)(p_Var4 + 0xc));
      break;
    }
  case 2:
    uVar2 = (ulong)(uint)(key->value_).b % (ulong)(~(-1 << (t->lsizenode & 0x1f)) | 1);
  }
  return t->node + uVar2;
}

Assistant:

static Node *mainposition (const Table *t, const TValue *key) {
  switch (ttype(key)) {
    case LUA_TNUMBER:
      return hashnum(t, nvalue(key));
    case LUA_TLNGSTR: {
      TString *s = rawtsvalue(key);
      if (s->tsv.extra == 0) {  /* no hash? */
        s->tsv.hash = luaS_hash(getstr(s), s->tsv.len, s->tsv.hash);
        s->tsv.extra = 1;  /* now it has its hash */
      }
      return hashstr(t, rawtsvalue(key));
    }
    case LUA_TSHRSTR:
      return hashstr(t, rawtsvalue(key));
    case LUA_TBOOLEAN:
      return hashboolean(t, bvalue(key));
    case LUA_TLIGHTUSERDATA:
      return hashpointer(t, pvalue(key));
    case LUA_TLCF:
      return hashpointer(t, fvalue(key));
    default:
      return hashpointer(t, gcvalue(key));
  }
}